

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeStateApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::enablei(NegativeTestContext *ctx)

{
  NegativeTestContext *pNVar1;
  bool bVar2;
  deBool dVar3;
  RenderContext *pRVar4;
  NotSupportedError *this;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_49;
  string local_48;
  deUint32 local_18;
  ContextType local_14;
  NegativeTestContext *local_10;
  NegativeTestContext *ctx_local;
  
  local_10 = ctx;
  while( true ) {
    dVar3 = ::deGetFalse();
    if (dVar3 != 0) break;
    pRVar4 = NegativeTestContext::getRenderContext(local_10);
    local_14.super_ApiType.m_bits = (ApiType)(*pRVar4->_vptr_RenderContext[2])();
    local_18 = (deUint32)glu::ApiType::es(3,2);
    bVar2 = glu::contextSupports(local_14,(ApiType)local_18);
    if (!bVar2) break;
    dVar3 = ::deGetFalse();
    pNVar1 = local_10;
    if (dVar3 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,
                 "GL_INVALID_ENUM is generated if cap is not one of the allowed values.",&local_49);
      NegativeTestContext::beginSection(pNVar1,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::allocator<char>::~allocator(&local_49);
      glu::CallLogWrapper::glEnablei(&local_10->super_CallLogWrapper,0xffffffff,0xffffffff);
      NegativeTestContext::expectError(local_10,0x500);
      NegativeTestContext::endSection(local_10);
      pNVar1 = local_10;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,
                 "GL_INVALID_VALUE is generated  if index is greater than or equal to the number of indexed capabilities for cap."
                 ,&local_71);
      NegativeTestContext::beginSection(pNVar1,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::allocator<char>::~allocator(&local_71);
      glu::CallLogWrapper::glEnablei(&local_10->super_CallLogWrapper,0xbe2,0xffffffff);
      NegativeTestContext::expectError(local_10,0x501);
      NegativeTestContext::endSection(local_10);
      return;
    }
  }
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this,"This test requires a higher context version.",
             "contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2))",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fNegativeStateApiTests.cpp"
             ,0x5e);
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

void enablei (NegativeTestContext& ctx)
{
	TCU_CHECK_AND_THROW(NotSupportedError, contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)), "This test requires a higher context version.");

	ctx.beginSection("GL_INVALID_ENUM is generated if cap is not one of the allowed values.");
	ctx.glEnablei(-1, -1);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated  if index is greater than or equal to the number of indexed capabilities for cap.");
	ctx.glEnablei(GL_BLEND, -1);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();
}